

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set_members_test.h
# Opt level: O1

void __thiscall
phmap::priv::gtest_suite_MembersTest_::
BeginEnd<phmap::flat_hash_set<phmap::priv::hash_internal::EnumClass,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>_>
::TestBody(BeginEnd<phmap::flat_hash_set<phmap::priv::hash_internal::EnumClass,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>_>
           *this)

{
  char cVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  undefined1 auVar15 [11];
  undefined1 auVar16 [11];
  undefined1 auVar17 [11];
  undefined1 auVar18 [11];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [13];
  undefined1 auVar24 [13];
  undefined1 auVar25 [13];
  undefined1 auVar26 [13];
  undefined1 auVar27 [14];
  undefined1 auVar28 [14];
  undefined1 auVar29 [14];
  undefined1 auVar30 [14];
  ulong uVar31;
  uint uVar32;
  char *pcVar33;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  AssertionResult gtest_ar;
  TypeParam t;
  EnumClass local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  iterator local_78;
  iterator local_68;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  local_58;
  allocator_type local_10;
  
  local_88 = kEmpty;
  local_78.ctrl_ =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
       next_id<phmap::priv::StatefulTestingHash>()::gId;
  local_68.ctrl_ =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
       next_id<phmap::priv::StatefulTestingEqual>()::gId;
  local_10.id_ = 0;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
  next_id<phmap::priv::StatefulTestingHash>()::gId =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
       next_id<phmap::priv::StatefulTestingHash>()::gId + 1;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
  next_id<phmap::priv::StatefulTestingEqual>()::gId =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
       next_id<phmap::priv::StatefulTestingEqual>()::gId + 1;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::EnumClass>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>>
  ::raw_hash_set<phmap::priv::hash_internal::EnumClass_const*>
            ((raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::EnumClass>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>>
              *)&local_58,&local_88,(EnumClass *)&local_80,0,(hasher *)&local_78,
             (key_equal *)&local_68,&local_10);
  local_68.field_1.slot_ = local_58.slots_;
  local_68.ctrl_ = local_58.ctrl_;
  if ((long *)local_58.ctrl_ == (long *)0x0) {
    local_78.ctrl_ = local_58.ctrl_;
    local_78.field_1.slot_ = local_58.slots_;
  }
  else {
    cVar1 = *local_58.ctrl_;
    local_78.ctrl_ = local_58.ctrl_;
    local_78.field_1.slot_ = local_58.slots_;
    while (cVar1 < -1) {
      iVar11 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                      CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
      iVar12 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                      CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
      iVar13 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                      CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
      iVar14 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                      CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
      in_XMM1_Ba = -((char)*(long *)local_78.ctrl_ < (char)iVar11);
      in_XMM1_Bb = -(*(char *)((long)local_78.ctrl_ + 1) < (char)((uint)iVar11 >> 8));
      in_XMM1_Bc = -(*(char *)((long)local_78.ctrl_ + 2) < (char)((uint)iVar11 >> 0x10));
      in_XMM1_Bd = -(*(char *)((long)local_78.ctrl_ + 3) < (char)((uint)iVar11 >> 0x18));
      in_XMM1_Be = -(*(char *)((long)local_78.ctrl_ + 4) < (char)iVar12);
      in_XMM1_Bf = -(*(char *)((long)local_78.ctrl_ + 5) < (char)((uint)iVar12 >> 8));
      in_XMM1_Bg = -(*(char *)((long)local_78.ctrl_ + 6) < (char)((uint)iVar12 >> 0x10));
      in_XMM1_Bh = -(*(char *)((long)local_78.ctrl_ + 7) < (char)((uint)iVar12 >> 0x18));
      in_XMM1_Bi = -((char)*(long *)((long)local_78.ctrl_ + 8) < (char)iVar13);
      in_XMM1_Bj = -(*(char *)((long)local_78.ctrl_ + 9) < (char)((uint)iVar13 >> 8));
      in_XMM1_Bk = -(*(char *)((long)local_78.ctrl_ + 10) < (char)((uint)iVar13 >> 0x10));
      in_XMM1_Bl = -(*(char *)((long)local_78.ctrl_ + 0xb) < (char)((uint)iVar13 >> 0x18));
      in_XMM1_Bm = -(*(char *)((long)local_78.ctrl_ + 0xc) < (char)iVar14);
      in_XMM1_Bn = -(*(char *)((long)local_78.ctrl_ + 0xd) < (char)((uint)iVar14 >> 8));
      in_XMM1_Bo = -(*(char *)((long)local_78.ctrl_ + 0xe) < (char)((uint)iVar14 >> 0x10));
      in_XMM1_Bp = -(*(char *)((long)local_78.ctrl_ + 0xf) < (char)((uint)iVar14 >> 0x18));
      auVar3[1] = in_XMM1_Bb;
      auVar3[0] = in_XMM1_Ba;
      auVar3[2] = in_XMM1_Bc;
      auVar3[3] = in_XMM1_Bd;
      auVar3[4] = in_XMM1_Be;
      auVar3[5] = in_XMM1_Bf;
      auVar3[6] = in_XMM1_Bg;
      auVar3[7] = in_XMM1_Bh;
      auVar3[8] = in_XMM1_Bi;
      auVar3[9] = in_XMM1_Bj;
      auVar3[10] = in_XMM1_Bk;
      auVar3[0xb] = in_XMM1_Bl;
      auVar3[0xc] = in_XMM1_Bm;
      auVar3[0xd] = in_XMM1_Bn;
      auVar3[0xe] = in_XMM1_Bo;
      auVar3[0xf] = in_XMM1_Bp;
      auVar4[1] = in_XMM1_Bb;
      auVar4[0] = in_XMM1_Ba;
      auVar4[2] = in_XMM1_Bc;
      auVar4[3] = in_XMM1_Bd;
      auVar4[4] = in_XMM1_Be;
      auVar4[5] = in_XMM1_Bf;
      auVar4[6] = in_XMM1_Bg;
      auVar4[7] = in_XMM1_Bh;
      auVar4[8] = in_XMM1_Bi;
      auVar4[9] = in_XMM1_Bj;
      auVar4[10] = in_XMM1_Bk;
      auVar4[0xb] = in_XMM1_Bl;
      auVar4[0xc] = in_XMM1_Bm;
      auVar4[0xd] = in_XMM1_Bn;
      auVar4[0xe] = in_XMM1_Bo;
      auVar4[0xf] = in_XMM1_Bp;
      auVar27[1] = in_XMM1_Bd;
      auVar27[0] = in_XMM1_Bc;
      auVar27[2] = in_XMM1_Be;
      auVar27[3] = in_XMM1_Bf;
      auVar27[4] = in_XMM1_Bg;
      auVar27[5] = in_XMM1_Bh;
      auVar27[6] = in_XMM1_Bi;
      auVar27[7] = in_XMM1_Bj;
      auVar27[8] = in_XMM1_Bk;
      auVar27[9] = in_XMM1_Bl;
      auVar27[10] = in_XMM1_Bm;
      auVar27[0xb] = in_XMM1_Bn;
      auVar27[0xc] = in_XMM1_Bo;
      auVar27[0xd] = in_XMM1_Bp;
      auVar23[1] = in_XMM1_Be;
      auVar23[0] = in_XMM1_Bd;
      auVar23[2] = in_XMM1_Bf;
      auVar23[3] = in_XMM1_Bg;
      auVar23[4] = in_XMM1_Bh;
      auVar23[5] = in_XMM1_Bi;
      auVar23[6] = in_XMM1_Bj;
      auVar23[7] = in_XMM1_Bk;
      auVar23[8] = in_XMM1_Bl;
      auVar23[9] = in_XMM1_Bm;
      auVar23[10] = in_XMM1_Bn;
      auVar23[0xb] = in_XMM1_Bo;
      auVar23[0xc] = in_XMM1_Bp;
      auVar19[1] = in_XMM1_Bf;
      auVar19[0] = in_XMM1_Be;
      auVar19[2] = in_XMM1_Bg;
      auVar19[3] = in_XMM1_Bh;
      auVar19[4] = in_XMM1_Bi;
      auVar19[5] = in_XMM1_Bj;
      auVar19[6] = in_XMM1_Bk;
      auVar19[7] = in_XMM1_Bl;
      auVar19[8] = in_XMM1_Bm;
      auVar19[9] = in_XMM1_Bn;
      auVar19[10] = in_XMM1_Bo;
      auVar19[0xb] = in_XMM1_Bp;
      auVar15[1] = in_XMM1_Bg;
      auVar15[0] = in_XMM1_Bf;
      auVar15[2] = in_XMM1_Bh;
      auVar15[3] = in_XMM1_Bi;
      auVar15[4] = in_XMM1_Bj;
      auVar15[5] = in_XMM1_Bk;
      auVar15[6] = in_XMM1_Bl;
      auVar15[7] = in_XMM1_Bm;
      auVar15[8] = in_XMM1_Bn;
      auVar15[9] = in_XMM1_Bo;
      auVar15[10] = in_XMM1_Bp;
      uVar32 = (ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB141(auVar27 >> 7,0) & 1) << 2 |
                        (ushort)(SUB131(auVar23 >> 7,0) & 1) << 3 |
                        (ushort)(SUB121(auVar19 >> 7,0) & 1) << 4 |
                        (ushort)(SUB111(auVar15 >> 7,0) & 1) << 5 |
                        (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                 CONCAT18(in_XMM1_Bo,
                                                          CONCAT17(in_XMM1_Bn,
                                                                   CONCAT16(in_XMM1_Bm,
                                                                            CONCAT15(in_XMM1_Bl,
                                                                                     CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                        (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                 CONCAT17(in_XMM1_Bo,
                                                          CONCAT16(in_XMM1_Bn,
                                                                   CONCAT15(in_XMM1_Bm,
                                                                            CONCAT14(in_XMM1_Bl,
                                                                                     CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                       7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
      uVar2 = 0;
      if (uVar32 != 0) {
        for (; (uVar32 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
      uVar31 = (ulong)uVar2;
      local_78.field_1.slot_ = local_78.field_1.slot_ + uVar31;
      cVar1 = *(char *)((long)local_78.ctrl_ + uVar31);
      local_78.ctrl_ = (ctrl_t *)((long)local_78.ctrl_ + uVar31);
    }
    if ((long *)local_58.ctrl_ != (long *)0x0) {
      cVar1 = *local_58.ctrl_;
      while (cVar1 < -1) {
        iVar11 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba)))
                        == CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba)))
                        );
        iVar12 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be)))
                        == CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be)))
                        );
        iVar13 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi)))
                        == CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi)))
                        );
        iVar14 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                        == CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                        );
        in_XMM1_Ba = -((char)*(long *)local_68.ctrl_ < (char)iVar11);
        in_XMM1_Bb = -(*(char *)((long)local_68.ctrl_ + 1) < (char)((uint)iVar11 >> 8));
        in_XMM1_Bc = -(*(char *)((long)local_68.ctrl_ + 2) < (char)((uint)iVar11 >> 0x10));
        in_XMM1_Bd = -(*(char *)((long)local_68.ctrl_ + 3) < (char)((uint)iVar11 >> 0x18));
        in_XMM1_Be = -(*(char *)((long)local_68.ctrl_ + 4) < (char)iVar12);
        in_XMM1_Bf = -(*(char *)((long)local_68.ctrl_ + 5) < (char)((uint)iVar12 >> 8));
        in_XMM1_Bg = -(*(char *)((long)local_68.ctrl_ + 6) < (char)((uint)iVar12 >> 0x10));
        in_XMM1_Bh = -(*(char *)((long)local_68.ctrl_ + 7) < (char)((uint)iVar12 >> 0x18));
        in_XMM1_Bi = -((char)*(long *)((long)local_68.ctrl_ + 8) < (char)iVar13);
        in_XMM1_Bj = -(*(char *)((long)local_68.ctrl_ + 9) < (char)((uint)iVar13 >> 8));
        in_XMM1_Bk = -(*(char *)((long)local_68.ctrl_ + 10) < (char)((uint)iVar13 >> 0x10));
        in_XMM1_Bl = -(*(char *)((long)local_68.ctrl_ + 0xb) < (char)((uint)iVar13 >> 0x18));
        in_XMM1_Bm = -(*(char *)((long)local_68.ctrl_ + 0xc) < (char)iVar14);
        in_XMM1_Bn = -(*(char *)((long)local_68.ctrl_ + 0xd) < (char)((uint)iVar14 >> 8));
        in_XMM1_Bo = -(*(char *)((long)local_68.ctrl_ + 0xe) < (char)((uint)iVar14 >> 0x10));
        in_XMM1_Bp = -(*(char *)((long)local_68.ctrl_ + 0xf) < (char)((uint)iVar14 >> 0x18));
        auVar5[1] = in_XMM1_Bb;
        auVar5[0] = in_XMM1_Ba;
        auVar5[2] = in_XMM1_Bc;
        auVar5[3] = in_XMM1_Bd;
        auVar5[4] = in_XMM1_Be;
        auVar5[5] = in_XMM1_Bf;
        auVar5[6] = in_XMM1_Bg;
        auVar5[7] = in_XMM1_Bh;
        auVar5[8] = in_XMM1_Bi;
        auVar5[9] = in_XMM1_Bj;
        auVar5[10] = in_XMM1_Bk;
        auVar5[0xb] = in_XMM1_Bl;
        auVar5[0xc] = in_XMM1_Bm;
        auVar5[0xd] = in_XMM1_Bn;
        auVar5[0xe] = in_XMM1_Bo;
        auVar5[0xf] = in_XMM1_Bp;
        auVar6[1] = in_XMM1_Bb;
        auVar6[0] = in_XMM1_Ba;
        auVar6[2] = in_XMM1_Bc;
        auVar6[3] = in_XMM1_Bd;
        auVar6[4] = in_XMM1_Be;
        auVar6[5] = in_XMM1_Bf;
        auVar6[6] = in_XMM1_Bg;
        auVar6[7] = in_XMM1_Bh;
        auVar6[8] = in_XMM1_Bi;
        auVar6[9] = in_XMM1_Bj;
        auVar6[10] = in_XMM1_Bk;
        auVar6[0xb] = in_XMM1_Bl;
        auVar6[0xc] = in_XMM1_Bm;
        auVar6[0xd] = in_XMM1_Bn;
        auVar6[0xe] = in_XMM1_Bo;
        auVar6[0xf] = in_XMM1_Bp;
        auVar28[1] = in_XMM1_Bd;
        auVar28[0] = in_XMM1_Bc;
        auVar28[2] = in_XMM1_Be;
        auVar28[3] = in_XMM1_Bf;
        auVar28[4] = in_XMM1_Bg;
        auVar28[5] = in_XMM1_Bh;
        auVar28[6] = in_XMM1_Bi;
        auVar28[7] = in_XMM1_Bj;
        auVar28[8] = in_XMM1_Bk;
        auVar28[9] = in_XMM1_Bl;
        auVar28[10] = in_XMM1_Bm;
        auVar28[0xb] = in_XMM1_Bn;
        auVar28[0xc] = in_XMM1_Bo;
        auVar28[0xd] = in_XMM1_Bp;
        auVar24[1] = in_XMM1_Be;
        auVar24[0] = in_XMM1_Bd;
        auVar24[2] = in_XMM1_Bf;
        auVar24[3] = in_XMM1_Bg;
        auVar24[4] = in_XMM1_Bh;
        auVar24[5] = in_XMM1_Bi;
        auVar24[6] = in_XMM1_Bj;
        auVar24[7] = in_XMM1_Bk;
        auVar24[8] = in_XMM1_Bl;
        auVar24[9] = in_XMM1_Bm;
        auVar24[10] = in_XMM1_Bn;
        auVar24[0xb] = in_XMM1_Bo;
        auVar24[0xc] = in_XMM1_Bp;
        auVar20[1] = in_XMM1_Bf;
        auVar20[0] = in_XMM1_Be;
        auVar20[2] = in_XMM1_Bg;
        auVar20[3] = in_XMM1_Bh;
        auVar20[4] = in_XMM1_Bi;
        auVar20[5] = in_XMM1_Bj;
        auVar20[6] = in_XMM1_Bk;
        auVar20[7] = in_XMM1_Bl;
        auVar20[8] = in_XMM1_Bm;
        auVar20[9] = in_XMM1_Bn;
        auVar20[10] = in_XMM1_Bo;
        auVar20[0xb] = in_XMM1_Bp;
        auVar16[1] = in_XMM1_Bg;
        auVar16[0] = in_XMM1_Bf;
        auVar16[2] = in_XMM1_Bh;
        auVar16[3] = in_XMM1_Bi;
        auVar16[4] = in_XMM1_Bj;
        auVar16[5] = in_XMM1_Bk;
        auVar16[6] = in_XMM1_Bl;
        auVar16[7] = in_XMM1_Bm;
        auVar16[8] = in_XMM1_Bn;
        auVar16[9] = in_XMM1_Bo;
        auVar16[10] = in_XMM1_Bp;
        uVar32 = (ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB141(auVar28 >> 7,0) & 1) << 2 |
                          (ushort)(SUB131(auVar24 >> 7,0) & 1) << 3 |
                          (ushort)(SUB121(auVar20 >> 7,0) & 1) << 4 |
                          (ushort)(SUB111(auVar16 >> 7,0) & 1) << 5 |
                          (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                   CONCAT18(in_XMM1_Bo,
                                                            CONCAT17(in_XMM1_Bn,
                                                                     CONCAT16(in_XMM1_Bm,
                                                                              CONCAT15(in_XMM1_Bl,
                                                                                       CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                          (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                   CONCAT17(in_XMM1_Bo,
                                                            CONCAT16(in_XMM1_Bn,
                                                                     CONCAT15(in_XMM1_Bm,
                                                                              CONCAT14(in_XMM1_Bl,
                                                                                       CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                         7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
        uVar2 = 0;
        if (uVar32 != 0) {
          for (; (uVar32 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        uVar31 = (ulong)uVar2;
        local_68.field_1.slot_ = local_68.field_1.slot_ + uVar31;
        cVar1 = *(char *)((long)local_68.ctrl_ + uVar31);
        local_68.ctrl_ = (ctrl_t *)((long)local_68.ctrl_ + uVar31);
      }
    }
  }
  testing::internal::
  CmpHelperEQ<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::EnumClass>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>>::iterator,phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::EnumClass>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>>::const_iterator>
            ((internal *)&local_88,"t.begin()","t.cbegin()",&local_78,(const_iterator *)&local_68);
  if ((internal)(undefined1)local_88 == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar33 = "";
    }
    else {
      pcVar33 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_members_test.h"
               ,0x48,pcVar33);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if ((long *)local_78.ctrl_ != (long *)0x0) {
      (**(code **)(*(long *)local_78.ctrl_ + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_78.ctrl_ = (ctrl_t *)((long)local_58.ctrl_ + local_58.capacity_);
  local_68.ctrl_ = local_78.ctrl_;
  testing::internal::
  CmpHelperEQ<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::EnumClass>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>>::iterator,phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::EnumClass>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>>::const_iterator>
            ((internal *)&local_88,"t.end()","t.cend()",&local_78,(const_iterator *)&local_68);
  if ((internal)(undefined1)local_88 == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar33 = "";
    }
    else {
      pcVar33 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_members_test.h"
               ,0x49,pcVar33);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if ((long *)local_78.ctrl_ != (long *)0x0) {
      (**(code **)(*(long *)local_78.ctrl_ + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_78.field_1.slot_ = local_58.slots_;
  local_78.ctrl_ = local_58.ctrl_;
  if ((long *)local_58.ctrl_ != (long *)0x0) {
    cVar1 = *local_58.ctrl_;
    local_78.ctrl_ = local_58.ctrl_;
    while (cVar1 < -1) {
      iVar11 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                      CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
      iVar12 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                      CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
      iVar13 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                      CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
      iVar14 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                      CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
      in_XMM1_Ba = -((char)*(long *)local_78.ctrl_ < (char)iVar11);
      in_XMM1_Bb = -(*(char *)((long)local_78.ctrl_ + 1) < (char)((uint)iVar11 >> 8));
      in_XMM1_Bc = -(*(char *)((long)local_78.ctrl_ + 2) < (char)((uint)iVar11 >> 0x10));
      in_XMM1_Bd = -(*(char *)((long)local_78.ctrl_ + 3) < (char)((uint)iVar11 >> 0x18));
      in_XMM1_Be = -(*(char *)((long)local_78.ctrl_ + 4) < (char)iVar12);
      in_XMM1_Bf = -(*(char *)((long)local_78.ctrl_ + 5) < (char)((uint)iVar12 >> 8));
      in_XMM1_Bg = -(*(char *)((long)local_78.ctrl_ + 6) < (char)((uint)iVar12 >> 0x10));
      in_XMM1_Bh = -(*(char *)((long)local_78.ctrl_ + 7) < (char)((uint)iVar12 >> 0x18));
      in_XMM1_Bi = -((char)*(long *)((long)local_78.ctrl_ + 8) < (char)iVar13);
      in_XMM1_Bj = -(*(char *)((long)local_78.ctrl_ + 9) < (char)((uint)iVar13 >> 8));
      in_XMM1_Bk = -(*(char *)((long)local_78.ctrl_ + 10) < (char)((uint)iVar13 >> 0x10));
      in_XMM1_Bl = -(*(char *)((long)local_78.ctrl_ + 0xb) < (char)((uint)iVar13 >> 0x18));
      in_XMM1_Bm = -(*(char *)((long)local_78.ctrl_ + 0xc) < (char)iVar14);
      in_XMM1_Bn = -(*(char *)((long)local_78.ctrl_ + 0xd) < (char)((uint)iVar14 >> 8));
      in_XMM1_Bo = -(*(char *)((long)local_78.ctrl_ + 0xe) < (char)((uint)iVar14 >> 0x10));
      in_XMM1_Bp = -(*(char *)((long)local_78.ctrl_ + 0xf) < (char)((uint)iVar14 >> 0x18));
      auVar7[1] = in_XMM1_Bb;
      auVar7[0] = in_XMM1_Ba;
      auVar7[2] = in_XMM1_Bc;
      auVar7[3] = in_XMM1_Bd;
      auVar7[4] = in_XMM1_Be;
      auVar7[5] = in_XMM1_Bf;
      auVar7[6] = in_XMM1_Bg;
      auVar7[7] = in_XMM1_Bh;
      auVar7[8] = in_XMM1_Bi;
      auVar7[9] = in_XMM1_Bj;
      auVar7[10] = in_XMM1_Bk;
      auVar7[0xb] = in_XMM1_Bl;
      auVar7[0xc] = in_XMM1_Bm;
      auVar7[0xd] = in_XMM1_Bn;
      auVar7[0xe] = in_XMM1_Bo;
      auVar7[0xf] = in_XMM1_Bp;
      auVar8[1] = in_XMM1_Bb;
      auVar8[0] = in_XMM1_Ba;
      auVar8[2] = in_XMM1_Bc;
      auVar8[3] = in_XMM1_Bd;
      auVar8[4] = in_XMM1_Be;
      auVar8[5] = in_XMM1_Bf;
      auVar8[6] = in_XMM1_Bg;
      auVar8[7] = in_XMM1_Bh;
      auVar8[8] = in_XMM1_Bi;
      auVar8[9] = in_XMM1_Bj;
      auVar8[10] = in_XMM1_Bk;
      auVar8[0xb] = in_XMM1_Bl;
      auVar8[0xc] = in_XMM1_Bm;
      auVar8[0xd] = in_XMM1_Bn;
      auVar8[0xe] = in_XMM1_Bo;
      auVar8[0xf] = in_XMM1_Bp;
      auVar29[1] = in_XMM1_Bd;
      auVar29[0] = in_XMM1_Bc;
      auVar29[2] = in_XMM1_Be;
      auVar29[3] = in_XMM1_Bf;
      auVar29[4] = in_XMM1_Bg;
      auVar29[5] = in_XMM1_Bh;
      auVar29[6] = in_XMM1_Bi;
      auVar29[7] = in_XMM1_Bj;
      auVar29[8] = in_XMM1_Bk;
      auVar29[9] = in_XMM1_Bl;
      auVar29[10] = in_XMM1_Bm;
      auVar29[0xb] = in_XMM1_Bn;
      auVar29[0xc] = in_XMM1_Bo;
      auVar29[0xd] = in_XMM1_Bp;
      auVar25[1] = in_XMM1_Be;
      auVar25[0] = in_XMM1_Bd;
      auVar25[2] = in_XMM1_Bf;
      auVar25[3] = in_XMM1_Bg;
      auVar25[4] = in_XMM1_Bh;
      auVar25[5] = in_XMM1_Bi;
      auVar25[6] = in_XMM1_Bj;
      auVar25[7] = in_XMM1_Bk;
      auVar25[8] = in_XMM1_Bl;
      auVar25[9] = in_XMM1_Bm;
      auVar25[10] = in_XMM1_Bn;
      auVar25[0xb] = in_XMM1_Bo;
      auVar25[0xc] = in_XMM1_Bp;
      auVar21[1] = in_XMM1_Bf;
      auVar21[0] = in_XMM1_Be;
      auVar21[2] = in_XMM1_Bg;
      auVar21[3] = in_XMM1_Bh;
      auVar21[4] = in_XMM1_Bi;
      auVar21[5] = in_XMM1_Bj;
      auVar21[6] = in_XMM1_Bk;
      auVar21[7] = in_XMM1_Bl;
      auVar21[8] = in_XMM1_Bm;
      auVar21[9] = in_XMM1_Bn;
      auVar21[10] = in_XMM1_Bo;
      auVar21[0xb] = in_XMM1_Bp;
      auVar17[1] = in_XMM1_Bg;
      auVar17[0] = in_XMM1_Bf;
      auVar17[2] = in_XMM1_Bh;
      auVar17[3] = in_XMM1_Bi;
      auVar17[4] = in_XMM1_Bj;
      auVar17[5] = in_XMM1_Bk;
      auVar17[6] = in_XMM1_Bl;
      auVar17[7] = in_XMM1_Bm;
      auVar17[8] = in_XMM1_Bn;
      auVar17[9] = in_XMM1_Bo;
      auVar17[10] = in_XMM1_Bp;
      uVar32 = (ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB141(auVar29 >> 7,0) & 1) << 2 |
                        (ushort)(SUB131(auVar25 >> 7,0) & 1) << 3 |
                        (ushort)(SUB121(auVar21 >> 7,0) & 1) << 4 |
                        (ushort)(SUB111(auVar17 >> 7,0) & 1) << 5 |
                        (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                 CONCAT18(in_XMM1_Bo,
                                                          CONCAT17(in_XMM1_Bn,
                                                                   CONCAT16(in_XMM1_Bm,
                                                                            CONCAT15(in_XMM1_Bl,
                                                                                     CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                        (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                 CONCAT17(in_XMM1_Bo,
                                                          CONCAT16(in_XMM1_Bn,
                                                                   CONCAT15(in_XMM1_Bm,
                                                                            CONCAT14(in_XMM1_Bl,
                                                                                     CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                       7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
      uVar2 = 0;
      if (uVar32 != 0) {
        for (; (uVar32 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
      uVar31 = (ulong)uVar2;
      local_78.field_1.slot_ = local_78.field_1.slot_ + uVar31;
      cVar1 = *(char *)((long)local_78.ctrl_ + uVar31);
      local_78.ctrl_ = (ctrl_t *)((long)local_78.ctrl_ + uVar31);
    }
  }
  local_68.ctrl_ = (ctrl_t *)((long)local_58.ctrl_ + local_58.capacity_);
  testing::internal::
  CmpHelperNE<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::EnumClass>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>>::iterator,phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::EnumClass>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>>::iterator>
            ((internal *)&local_88,"t.begin()","t.end()",&local_78,&local_68);
  if ((internal)(undefined1)local_88 == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar33 = "";
    }
    else {
      pcVar33 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_members_test.h"
               ,0x4a,pcVar33);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if ((long *)local_78.ctrl_ != (long *)0x0) {
      (**(code **)(*(long *)local_78.ctrl_ + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_78.ctrl_ = local_58.ctrl_;
  if ((long *)local_58.ctrl_ != (long *)0x0) {
    cVar1 = *local_58.ctrl_;
    local_78.ctrl_ = local_58.ctrl_;
    while (cVar1 < -1) {
      iVar11 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                      CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
      iVar12 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                      CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
      iVar13 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                      CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
      iVar14 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                      CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
      in_XMM1_Ba = -((char)*(long *)local_78.ctrl_ < (char)iVar11);
      in_XMM1_Bb = -(*(char *)((long)local_78.ctrl_ + 1) < (char)((uint)iVar11 >> 8));
      in_XMM1_Bc = -(*(char *)((long)local_78.ctrl_ + 2) < (char)((uint)iVar11 >> 0x10));
      in_XMM1_Bd = -(*(char *)((long)local_78.ctrl_ + 3) < (char)((uint)iVar11 >> 0x18));
      in_XMM1_Be = -(*(char *)((long)local_78.ctrl_ + 4) < (char)iVar12);
      in_XMM1_Bf = -(*(char *)((long)local_78.ctrl_ + 5) < (char)((uint)iVar12 >> 8));
      in_XMM1_Bg = -(*(char *)((long)local_78.ctrl_ + 6) < (char)((uint)iVar12 >> 0x10));
      in_XMM1_Bh = -(*(char *)((long)local_78.ctrl_ + 7) < (char)((uint)iVar12 >> 0x18));
      in_XMM1_Bi = -((char)*(long *)((long)local_78.ctrl_ + 8) < (char)iVar13);
      in_XMM1_Bj = -(*(char *)((long)local_78.ctrl_ + 9) < (char)((uint)iVar13 >> 8));
      in_XMM1_Bk = -(*(char *)((long)local_78.ctrl_ + 10) < (char)((uint)iVar13 >> 0x10));
      in_XMM1_Bl = -(*(char *)((long)local_78.ctrl_ + 0xb) < (char)((uint)iVar13 >> 0x18));
      in_XMM1_Bm = -(*(char *)((long)local_78.ctrl_ + 0xc) < (char)iVar14);
      in_XMM1_Bn = -(*(char *)((long)local_78.ctrl_ + 0xd) < (char)((uint)iVar14 >> 8));
      in_XMM1_Bo = -(*(char *)((long)local_78.ctrl_ + 0xe) < (char)((uint)iVar14 >> 0x10));
      in_XMM1_Bp = -(*(char *)((long)local_78.ctrl_ + 0xf) < (char)((uint)iVar14 >> 0x18));
      auVar9[1] = in_XMM1_Bb;
      auVar9[0] = in_XMM1_Ba;
      auVar9[2] = in_XMM1_Bc;
      auVar9[3] = in_XMM1_Bd;
      auVar9[4] = in_XMM1_Be;
      auVar9[5] = in_XMM1_Bf;
      auVar9[6] = in_XMM1_Bg;
      auVar9[7] = in_XMM1_Bh;
      auVar9[8] = in_XMM1_Bi;
      auVar9[9] = in_XMM1_Bj;
      auVar9[10] = in_XMM1_Bk;
      auVar9[0xb] = in_XMM1_Bl;
      auVar9[0xc] = in_XMM1_Bm;
      auVar9[0xd] = in_XMM1_Bn;
      auVar9[0xe] = in_XMM1_Bo;
      auVar9[0xf] = in_XMM1_Bp;
      auVar10[1] = in_XMM1_Bb;
      auVar10[0] = in_XMM1_Ba;
      auVar10[2] = in_XMM1_Bc;
      auVar10[3] = in_XMM1_Bd;
      auVar10[4] = in_XMM1_Be;
      auVar10[5] = in_XMM1_Bf;
      auVar10[6] = in_XMM1_Bg;
      auVar10[7] = in_XMM1_Bh;
      auVar10[8] = in_XMM1_Bi;
      auVar10[9] = in_XMM1_Bj;
      auVar10[10] = in_XMM1_Bk;
      auVar10[0xb] = in_XMM1_Bl;
      auVar10[0xc] = in_XMM1_Bm;
      auVar10[0xd] = in_XMM1_Bn;
      auVar10[0xe] = in_XMM1_Bo;
      auVar10[0xf] = in_XMM1_Bp;
      auVar30[1] = in_XMM1_Bd;
      auVar30[0] = in_XMM1_Bc;
      auVar30[2] = in_XMM1_Be;
      auVar30[3] = in_XMM1_Bf;
      auVar30[4] = in_XMM1_Bg;
      auVar30[5] = in_XMM1_Bh;
      auVar30[6] = in_XMM1_Bi;
      auVar30[7] = in_XMM1_Bj;
      auVar30[8] = in_XMM1_Bk;
      auVar30[9] = in_XMM1_Bl;
      auVar30[10] = in_XMM1_Bm;
      auVar30[0xb] = in_XMM1_Bn;
      auVar30[0xc] = in_XMM1_Bo;
      auVar30[0xd] = in_XMM1_Bp;
      auVar26[1] = in_XMM1_Be;
      auVar26[0] = in_XMM1_Bd;
      auVar26[2] = in_XMM1_Bf;
      auVar26[3] = in_XMM1_Bg;
      auVar26[4] = in_XMM1_Bh;
      auVar26[5] = in_XMM1_Bi;
      auVar26[6] = in_XMM1_Bj;
      auVar26[7] = in_XMM1_Bk;
      auVar26[8] = in_XMM1_Bl;
      auVar26[9] = in_XMM1_Bm;
      auVar26[10] = in_XMM1_Bn;
      auVar26[0xb] = in_XMM1_Bo;
      auVar26[0xc] = in_XMM1_Bp;
      auVar22[1] = in_XMM1_Bf;
      auVar22[0] = in_XMM1_Be;
      auVar22[2] = in_XMM1_Bg;
      auVar22[3] = in_XMM1_Bh;
      auVar22[4] = in_XMM1_Bi;
      auVar22[5] = in_XMM1_Bj;
      auVar22[6] = in_XMM1_Bk;
      auVar22[7] = in_XMM1_Bl;
      auVar22[8] = in_XMM1_Bm;
      auVar22[9] = in_XMM1_Bn;
      auVar22[10] = in_XMM1_Bo;
      auVar22[0xb] = in_XMM1_Bp;
      auVar18[1] = in_XMM1_Bg;
      auVar18[0] = in_XMM1_Bf;
      auVar18[2] = in_XMM1_Bh;
      auVar18[3] = in_XMM1_Bi;
      auVar18[4] = in_XMM1_Bj;
      auVar18[5] = in_XMM1_Bk;
      auVar18[6] = in_XMM1_Bl;
      auVar18[7] = in_XMM1_Bm;
      auVar18[8] = in_XMM1_Bn;
      auVar18[9] = in_XMM1_Bo;
      auVar18[10] = in_XMM1_Bp;
      uVar32 = (ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB141(auVar30 >> 7,0) & 1) << 2 |
                        (ushort)(SUB131(auVar26 >> 7,0) & 1) << 3 |
                        (ushort)(SUB121(auVar22 >> 7,0) & 1) << 4 |
                        (ushort)(SUB111(auVar18 >> 7,0) & 1) << 5 |
                        (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                 CONCAT18(in_XMM1_Bo,
                                                          CONCAT17(in_XMM1_Bn,
                                                                   CONCAT16(in_XMM1_Bm,
                                                                            CONCAT15(in_XMM1_Bl,
                                                                                     CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                        (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                 CONCAT17(in_XMM1_Bo,
                                                          CONCAT16(in_XMM1_Bn,
                                                                   CONCAT15(in_XMM1_Bm,
                                                                            CONCAT14(in_XMM1_Bl,
                                                                                     CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                       7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
      uVar2 = 0;
      if (uVar32 != 0) {
        for (; (uVar32 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
      uVar31 = (ulong)uVar2;
      local_58.slots_ = local_58.slots_ + uVar31;
      cVar1 = *(char *)((long)local_78.ctrl_ + uVar31);
      local_78.ctrl_ = (ctrl_t *)((long)local_78.ctrl_ + uVar31);
    }
  }
  local_68.ctrl_ = (ctrl_t *)((long)local_58.ctrl_ + local_58.capacity_);
  local_78.field_1.slot_ = local_58.slots_;
  testing::internal::
  CmpHelperNE<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::EnumClass>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>>::const_iterator,phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::EnumClass>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>>::const_iterator>
            ((internal *)&local_88,"t.cbegin()","t.cend()",(const_iterator *)&local_78,
             (const_iterator *)&local_68);
  if ((internal)(undefined1)local_88 == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar33 = "";
    }
    else {
      pcVar33 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_members_test.h"
               ,0x4b,pcVar33);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if ((long *)local_78.ctrl_ != (long *)0x0) {
      (**(code **)(*(long *)local_78.ctrl_ + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  ::destroy_slots(&local_58);
  return;
}

Assistant:

TYPED_TEST_P(MembersTest, BeginEnd) {
  TypeParam t = {typename TypeParam::value_type{}};
  EXPECT_EQ(t.begin(), t.cbegin());
  EXPECT_EQ(t.end(), t.cend());
  EXPECT_NE(t.begin(), t.end());
  EXPECT_NE(t.cbegin(), t.cend());
}